

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::retranslateStrings
          (QFileSystemNode *this,QAbstractFileIconProvider *iconProvider,QString *path)

{
  QExtendedInformation *pQVar1;
  qsizetype qVar2;
  Span *pSVar3;
  QFileSystemNode *this_00;
  Data *pDVar4;
  char16_t *pcVar5;
  char cVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  piter local_78;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_50 [16];
  QFileSystemNode *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (iconProvider != (QAbstractFileIconProvider *)0x0) {
    if (this->info != (QExtendedInformation *)0x0) {
      QFileInfo::QFileInfo((QFileInfo *)local_50,(QString *)path);
      (*iconProvider->_vptr_QAbstractFileIconProvider[4])
                (&local_68,iconProvider,(QFileInfo *)local_50);
      pQVar1 = this->info;
      pDVar4 = (pQVar1->displayType).d.d;
      pcVar5 = (pQVar1->displayType).d.ptr;
      (pQVar1->displayType).d.d = local_68.d;
      (pQVar1->displayType).d.ptr = local_68.ptr;
      qVar2 = (pQVar1->displayType).d.size;
      (pQVar1->displayType).d.size = local_68.size;
      local_68.d = pDVar4;
      local_68.ptr = pcVar5;
      local_68.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QFileInfo::~QFileInfo((QFileInfo *)local_50);
    }
    local_78 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::begin
                                (&this->children);
    while( true ) {
      if (local_78.d ==
          (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)0x0 &&
          local_78.bucket == 0) break;
      pSVar3 = (local_78.d)->spans;
      uVar7 = local_78.bucket >> 7;
      this_00 = *(QFileSystemNode **)
                 (pSVar3[uVar7].entries[pSVar3[uVar7].offsets[(uint)local_78.bucket & 0x7f]].storage
                  .data + 0x18);
      if ((path->d).size == 0) {
        retranslateStrings(this_00,iconProvider,&this_00->fileName);
      }
      else {
        cVar6 = QString::endsWith((QChar)(char16_t)path,0x2f);
        local_50._0_8_ = path;
        if (cVar6 == '\0') {
          local_50._8_2_ = 0x2f;
          local_40 = this_00;
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&>::convertTo<QString>
                    ((QString *)&local_68,
                     (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&> *)
                     local_50);
        }
        else {
          local_50._8_8_ = this_00;
          QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                    ((QString *)&local_68,(QStringBuilder<const_QString_&,_QString_&> *)local_50);
        }
        retranslateStrings(this_00,iconProvider,(QString *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      }
      QHashPrivate::
      iterator<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::operator++
                (&local_78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateStrings(QAbstractFileIconProvider *iconProvider, const QString &path) {
            if (!iconProvider)
                return;

            if (info)
                info->displayType = iconProvider->type(QFileInfo(path));
            for (QFileSystemNode *child : std::as_const(children)) {
                //On windows the root (My computer) has no path so we don't want to add a / for nothing (e.g. /C:/)
                if (!path.isEmpty()) {
                    if (path.endsWith(u'/'))
                        child->retranslateStrings(iconProvider, path + child->fileName);
                    else
                        child->retranslateStrings(iconProvider, path + u'/' + child->fileName);
                } else
                    child->retranslateStrings(iconProvider, child->fileName);
            }
        }